

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_0::HeapTypeInfo::~HeapTypeInfo(HeapTypeInfo *this)

{
  HeapTypeKind HVar1;
  pointer pFVar2;
  
  HVar1 = this->kind;
  if ((1 < HVar1 - Array) && (HVar1 != Func)) {
    if (HVar1 != Struct) {
      handle_unreachable("unexpected kind",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                         ,0x1e4);
    }
    pFVar2 = (this->field_9).struct_.fields.
             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pFVar2 != (pointer)0x0) {
      operator_delete(pFVar2,(long)(this->field_9).struct_.fields.
                                   super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2)
      ;
      return;
    }
  }
  return;
}

Assistant:

HeapTypeInfo::~HeapTypeInfo() {
  switch (kind) {
    case HeapTypeKind::Func:
      signature.~Signature();
      return;
    case HeapTypeKind::Cont:
      continuation.~Continuation();
      return;
    case HeapTypeKind::Struct:
      struct_.~Struct();
      return;
    case HeapTypeKind::Array:
      array.~Array();
      return;
    case HeapTypeKind::Basic:
      break;
  }
  WASM_UNREACHABLE("unexpected kind");
}